

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nuklear.h
# Opt level: O1

int nk_group_begin(nk_context *ctx,char *title,nk_flags flags)

{
  nk_window *win;
  long lVar1;
  nk_hash name;
  int iVar2;
  nk_table *iter;
  nk_table *pnVar3;
  nk_uint *y_offset;
  nk_uint value;
  nk_table *pnVar4;
  ulong uVar5;
  nk_uint *extraout_RDX;
  undefined7 uVar6;
  long lVar7;
  ulong uVar8;
  ulong uVar9;
  nk_uint *unaff_R13;
  bool bVar10;
  
  if (ctx == (nk_context *)0x0) {
    __assert_fail("ctx",
                  "/workspace/llm4binary/github/license_c_cmakelists/Konf[P]LearnOpenGL-CLion/glfw/deps/nuklear.h"
                  ,0x566b,"int nk_group_begin(struct nk_context *, const char *, nk_flags)");
  }
  if (title == (char *)0x0) {
    __assert_fail("title",
                  "/workspace/llm4binary/github/license_c_cmakelists/Konf[P]LearnOpenGL-CLion/glfw/deps/nuklear.h"
                  ,0x566c,"int nk_group_begin(struct nk_context *, const char *, nk_flags)");
  }
  win = ctx->current;
  if (win == (nk_window *)0x0) {
    __assert_fail("ctx->current",
                  "/workspace/llm4binary/github/license_c_cmakelists/Konf[P]LearnOpenGL-CLion/glfw/deps/nuklear.h"
                  ,0x566d,"int nk_group_begin(struct nk_context *, const char *, nk_flags)");
  }
  if (win->layout == (nk_panel *)0x0) {
    __assert_fail("ctx->current->layout",
                  "/workspace/llm4binary/github/license_c_cmakelists/Konf[P]LearnOpenGL-CLion/glfw/deps/nuklear.h"
                  ,0x566e,"int nk_group_begin(struct nk_context *, const char *, nk_flags)");
  }
  if (*title == '\0') {
    lVar7 = 0;
  }
  else {
    lVar7 = 0;
    do {
      lVar1 = lVar7 + 1;
      lVar7 = lVar7 + 1;
    } while (title[lVar1] != '\0');
  }
  name = nk_murmur_hash(title,(int)lVar7,2);
  pnVar3 = win->tables;
  pnVar4 = pnVar3;
  y_offset = extraout_RDX;
  do {
    if (pnVar4 == (nk_table *)0x0) {
      unaff_R13 = (nk_uint *)0x0;
      break;
    }
    uVar8 = (ulong)pnVar4->size;
    uVar6 = (undefined7)((ulong)y_offset >> 8);
    y_offset = (nk_uint *)CONCAT71(uVar6,uVar8 != 0);
    if (uVar8 == 0) {
LAB_0013b508:
      pnVar4 = pnVar4->next;
    }
    else {
      if (pnVar4->keys[0] == name) {
        y_offset = (nk_uint *)CONCAT71(uVar6,1);
        uVar9 = 0;
      }
      else {
        uVar5 = 0;
        do {
          if (uVar8 - 1 == uVar5) {
            y_offset = (nk_uint *)CONCAT71((int7)(uVar5 + 1 >> 8),uVar5 + 1 < uVar8);
            goto LAB_0013b508;
          }
          uVar9 = uVar5 + 1;
          lVar7 = uVar5 + 1;
          uVar5 = uVar9;
        } while (pnVar4->keys[lVar7] != name);
        y_offset = (nk_uint *)CONCAT71((int7)(uVar9 >> 8),uVar9 < uVar8);
      }
      pnVar4->seq = win->seq;
      unaff_R13 = pnVar4->values + uVar9;
    }
  } while ((char)y_offset == '\0');
  value = (nk_uint)pnVar4;
  if (unaff_R13 == (nk_uint *)0x0) {
    unaff_R13 = nk_add_value(ctx,win,name,value);
    y_offset = nk_add_value(ctx,win,name + 1,value);
    *y_offset = 0;
    *unaff_R13 = 0;
  }
  else {
    do {
      if (pnVar3 == (nk_table *)0x0) {
        y_offset = (nk_uint *)0x0;
        break;
      }
      uVar8 = (ulong)pnVar3->size;
      bVar10 = uVar8 != 0;
      if (uVar8 == 0) {
LAB_0013b578:
        pnVar3 = pnVar3->next;
      }
      else {
        if (pnVar3->keys[0] == name + 1) {
          bVar10 = true;
          uVar9 = 0;
        }
        else {
          uVar5 = 0;
          do {
            if (uVar8 - 1 == uVar5) {
              bVar10 = uVar5 + 1 < uVar8;
              goto LAB_0013b578;
            }
            uVar9 = uVar5 + 1;
            lVar7 = uVar5 + 1;
            uVar5 = uVar9;
          } while (pnVar3->keys[lVar7] != name + 1);
          bVar10 = uVar9 < uVar8;
        }
        pnVar3->seq = win->seq;
        y_offset = pnVar3->values + uVar9;
      }
    } while (!bVar10);
  }
  iVar2 = nk_group_scrolled_offset_begin(ctx,unaff_R13,y_offset,title,flags);
  return iVar2;
}

Assistant:

NK_API int
nk_group_begin(struct nk_context *ctx, const char *title, nk_flags flags)
{
    int title_len;
    nk_hash title_hash;
    struct nk_window *win;
    nk_uint *x_offset;
    nk_uint *y_offset;

    NK_ASSERT(ctx);
    NK_ASSERT(title);
    NK_ASSERT(ctx->current);
    NK_ASSERT(ctx->current->layout);
    if (!ctx || !ctx->current || !ctx->current->layout || !title)
        return 0;

    /* find persistent group scrollbar value */
    win = ctx->current;
    title_len = (int)nk_strlen(title);
    title_hash = nk_murmur_hash(title, (int)title_len, NK_PANEL_GROUP);
    x_offset = nk_find_value(win, title_hash);
    if (!x_offset) {
        x_offset = nk_add_value(ctx, win, title_hash, 0);
        y_offset = nk_add_value(ctx, win, title_hash+1, 0);

        NK_ASSERT(x_offset);
        NK_ASSERT(y_offset);
        if (!x_offset || !y_offset) return 0;
        *x_offset = *y_offset = 0;
    } else y_offset = nk_find_value(win, title_hash+1);
    return nk_group_scrolled_offset_begin(ctx, x_offset, y_offset, title, flags);
}